

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# picotls.c
# Opt level: O1

int push_key_share_entry(ptls_buffer_t *buf,uint16_t group,ptls_iovec_t pubkey)

{
  uint8_t *puVar1;
  int iVar2;
  ulong uVar3;
  size_t delta;
  long lVar4;
  size_t sVar5;
  
  delta = pubkey.len;
  iVar2 = ptls_buffer_reserve(buf,2);
  if (iVar2 == 0) {
    *(uint16_t *)(buf->base + buf->off) = group << 8 | group >> 8;
    buf->off = buf->off + 2;
    iVar2 = 0;
  }
  if (iVar2 == 0) {
    iVar2 = ptls_buffer_reserve(buf,2);
    if (iVar2 == 0) {
      puVar1 = buf->base;
      sVar5 = buf->off;
      (puVar1 + sVar5)[0] = '\0';
      (puVar1 + sVar5)[1] = '\0';
      buf->off = buf->off + 2;
      iVar2 = 0;
    }
    if (iVar2 == 0) {
      sVar5 = buf->off;
      iVar2 = 0;
      if (delta != 0) {
        iVar2 = ptls_buffer_reserve(buf,delta);
        if (iVar2 == 0) {
          memcpy(buf->base + buf->off,pubkey.base,delta);
          buf->off = buf->off + delta;
          iVar2 = 0;
        }
      }
      if (iVar2 == 0) {
        uVar3 = buf->off - sVar5;
        lVar4 = 8;
        do {
          buf->base[sVar5 - 2] = (uint8_t)(uVar3 >> ((byte)lVar4 & 0x3f));
          lVar4 = lVar4 + -8;
          sVar5 = sVar5 + 1;
        } while (lVar4 != -8);
        iVar2 = 0;
      }
    }
  }
  return iVar2;
}

Assistant:

static int push_key_share_entry(ptls_buffer_t *buf, uint16_t group, ptls_iovec_t pubkey)
{
    int ret;

    ptls_buffer_push16(buf, group);
    ptls_buffer_push_block(buf, 2, { ptls_buffer_pushv(buf, pubkey.base, pubkey.len); });
    ret = 0;
Exit:
    return ret;
}